

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::create_voxel2beamlet_list
          (EvaluationFunction *this,vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,
          Collimator *collimator)

{
  pair<int,_int> pVar1;
  int iVar2;
  uint angle;
  Matrix *pMVar3;
  mapped_type *this_00;
  _Rb_tree<double,std::pair<double_const,std::pair<int,int>>,std::_Select1st<std::pair<double_const,std::pair<int,int>>>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
  *this_01;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  value_type vVar7;
  value_type vVar8;
  long lVar9;
  value_type local_80;
  pair<double,_std::pair<int,_int>_> local_78;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_68;
  ulong local_60;
  ulong local_58;
  _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  value_type local_40;
  pair<int,_int> local_38;
  
  local_48 = (_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->voxel2beamlet_list;
  local_50 = (_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->beamlet2voxel_list;
  uVar5 = 0;
  local_68 = volumes;
  while( true ) {
    iVar2 = Collimator::getNbAngles(collimator);
    if (iVar2 <= (int)uVar5) break;
    uVar4 = 0;
    local_60 = uVar5;
    while ((long)uVar4 < (long)this->nb_organs) {
      angle = Collimator::getAngle(collimator,(int)local_60);
      local_58 = uVar4;
      pMVar3 = Volume::getDepositionMatrix
                         ((local_68->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar4,angle);
      local_40.second = 0;
      local_40.first = angle;
      vVar7 = local_40;
      for (lVar9 = 0;
          lVar9 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_58]; lVar9 = lVar9 + 1) {
        local_38 = (pair<int,_int>)(lVar9 << 0x20 | local_58);
        lVar6 = 0;
        vVar8 = vVar7;
        while( true ) {
          iVar2 = Collimator::getNangleBeamlets(collimator,vVar8.first);
          pVar1 = local_38;
          if (iVar2 <= lVar6) break;
          if (0.0 < pMVar3->p[lVar9][lVar6]) {
            local_78.first = (double)local_38;
            this_00 = std::__detail::
                      _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_48,(key_type *)&local_78);
            local_80 = vVar7;
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            push_back(this_00,&local_80);
            local_80 = vVar7;
            this_01 = (_Rb_tree<double,std::pair<double_const,std::pair<int,int>>,std::_Select1st<std::pair<double_const,std::pair<int,int>>>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
                       *)std::__detail::
                         _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[](local_50,&local_80);
            vVar8 = local_40;
            local_78.first = (double)((ulong)pMVar3->p[lVar9][lVar6] | (ulong)DAT_00120a00);
            local_78.second = pVar1;
            std::
            _Rb_tree<double,std::pair<double_const,std::pair<int,int>>,std::_Select1st<std::pair<double_const,std::pair<int,int>>>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
            ::_M_emplace_equal<std::pair<double,std::pair<int,int>>>(this_01,&local_78);
          }
          lVar6 = lVar6 + 1;
          vVar7 = (value_type)((long)vVar7 + 0x100000000);
        }
        vVar7 = vVar8;
      }
      uVar4 = local_58 + 1;
    }
    uVar5 = (ulong)((int)local_60 + 1);
  }
  return;
}

Assistant:

void EvaluationFunction::create_voxel2beamlet_list(vector<Volume>& volumes, const Collimator& collimator){
	for (int i=0;i<collimator.getNbAngles();i++){
		for(int o=0; o<nb_organs; o++){
			 int angle = collimator.getAngle(i);
			 const Matrix&  D = volumes[o].getDepositionMatrix(angle);
			 for(int k=0; k<nb_voxels[o]; k++){
				 for(int b=0; b<collimator.getNangleBeamlets(angle); b++)
					 if(D(k,b) > 0.0) {
						 voxel2beamlet_list[make_pair(o,k)].push_back(make_pair(angle,b));
						 beamlet2voxel_list[make_pair(angle,b)].insert(make_pair(-abs(D(k,b)), make_pair(o,k)));
					 }
			 }
		}
	}
}